

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int cmf4kf_(int *lot,int *ido,int *l1,int *na,double *cc,int *im1,int *in1,double *ch,int *im2,
           int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  long in_R8;
  int *in_R9;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double ci3;
  double ci2;
  double sn;
  int *in_stack_00000018;
  int m2;
  int m1;
  int k;
  int i__;
  int i__4;
  int i__3;
  int i__2;
  int i__1;
  int wa_offset;
  int wa_dim1;
  int ch_offset;
  int ch_dim3;
  int ch_dim2;
  int cc_offset;
  int cc_dim4;
  int cc_dim3;
  int cc_dim2;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  double tr4;
  double tr3;
  double tr2;
  double tr1;
  int m2s;
  double ti4;
  double ti3;
  double ti2;
  double ti1;
  double cr4;
  double cr2;
  double cr3;
  int m1d;
  double ci4;
  
  iVar1 = *in_RSI;
  lVar13 = _i__ + (long)(iVar1 * 4 + 1) * -8;
  iVar2 = *(int *)ci2;
  iVar3 = *in_RDX;
  iVar4 = *in_RSI;
  lVar14 = in_R8 + (long)((iVar2 * (iVar3 * (iVar4 + 1) + 1) + 1) * 2 + 1) * -8;
  iVar5 = *_m1;
  iVar6 = *in_RDX;
  lVar15 = (long)sn + (long)((iVar5 * (iVar6 * 5 + 1) + 1) * 2 + 1) * -8;
  iVar11 = (*in_RDI + -1) * *in_R9 + 1;
  iVar12 = 1 - *in_stack_00000018;
  if (*in_RSI < 2) {
    dVar17 = 1.0 / (double)(*in_RDX << 2);
    if (*in_RCX == 1) {
      iVar1 = *in_RDX;
      for (local_74 = 1; local_74 <= iVar1; local_74 = local_74 + 1) {
        iVar7 = *in_R9;
        local_78 = 1;
        local_7c = iVar12;
        while( true ) {
          if (iVar7 < 0) {
            bVar10 = iVar11 <= local_78;
          }
          else {
            bVar10 = local_78 <= iVar11;
          }
          if (!bVar10) break;
          local_7c = *in_stack_00000018 + local_7c;
          dVar18 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2)
                              * 8) -
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 +
                                    2) * 8);
          dVar19 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2)
                              * 8) +
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 +
                                    2) * 8);
          dVar20 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 +
                                    2) * 8) -
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 +
                                    2) * 8);
          dVar21 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 +
                                    2) * 8) +
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 +
                                    2) * 8);
          dVar22 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1)
                              * 8) -
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 +
                                    1) * 8);
          dVar23 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1)
                              * 8) +
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 +
                                    1) * 8);
          dVar24 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 +
                                    1) * 8) -
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 +
                                    1) * 8);
          dVar16 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 +
                                    1) * 8) +
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 +
                                    1) * 8);
          *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 5) * iVar5) * 2 + 1) * 8) =
               dVar17 * (dVar23 + dVar16);
          *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 7) * iVar5) * 2 + 1) * 8) =
               dVar17 * (dVar23 - dVar16);
          *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 5) * iVar5) * 2 + 2) * 8) =
               dVar17 * (dVar19 + dVar21);
          *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 7) * iVar5) * 2 + 2) * 8) =
               dVar17 * (dVar19 - dVar21);
          *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 6) * iVar5) * 2 + 1) * 8) =
               dVar17 * (dVar22 + dVar20);
          *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 8) * iVar5) * 2 + 1) * 8) =
               dVar17 * (dVar22 - dVar20);
          *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 6) * iVar5) * 2 + 2) * 8) =
               dVar17 * (dVar18 + dVar24);
          *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 8) * iVar5) * 2 + 2) * 8) =
               dVar17 * (dVar18 - dVar24);
          local_78 = iVar7 + local_78;
        }
      }
    }
    else {
      iVar1 = *in_RDX;
      for (local_74 = 1; local_74 <= iVar1; local_74 = local_74 + 1) {
        iVar5 = *in_R9;
        local_78 = 1;
        while( true ) {
          if (iVar5 < 0) {
            bVar10 = iVar11 <= local_78;
          }
          else {
            bVar10 = local_78 <= iVar11;
          }
          if (!bVar10) break;
          dVar18 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2)
                              * 8) -
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 +
                                    2) * 8);
          dVar19 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2)
                              * 8) +
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 +
                                    2) * 8);
          dVar20 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 +
                                    2) * 8) -
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 +
                                    2) * 8);
          dVar21 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 +
                                    2) * 8) +
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 +
                                    2) * 8);
          dVar22 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1)
                              * 8) -
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 +
                                    1) * 8);
          dVar23 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1)
                              * 8) +
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 +
                                    1) * 8);
          dVar24 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 +
                                    1) * 8) -
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 +
                                    1) * 8);
          dVar16 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 +
                                    1) * 8) +
                   *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 +
                                    1) * 8);
          *(double *)
           (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1) * 8) =
               dVar17 * (dVar23 + dVar16);
          *(double *)
           (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 1) * 8)
               = dVar17 * (dVar23 - dVar16);
          *(double *)
           (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2) * 8) =
               dVar17 * (dVar19 + dVar21);
          *(double *)
           (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 2) * 8)
               = dVar17 * (dVar19 - dVar21);
          *(double *)
           (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 1) * 8)
               = dVar17 * (dVar22 + dVar20);
          *(double *)
           (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 1) * 8)
               = dVar17 * (dVar22 - dVar20);
          *(double *)
           (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 2) * 8)
               = dVar17 * (dVar18 + dVar24);
          *(double *)
           (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 2) * 8)
               = dVar17 * (dVar18 - dVar24);
          local_78 = iVar5 + local_78;
        }
      }
    }
  }
  else {
    iVar7 = *in_RDX;
    for (local_74 = 1; local_74 <= iVar7; local_74 = local_74 + 1) {
      iVar8 = *in_R9;
      local_78 = 1;
      local_7c = iVar12;
      while( true ) {
        if (iVar8 < 0) {
          bVar10 = iVar11 <= local_78;
        }
        else {
          bVar10 = local_78 <= iVar11;
        }
        if (!bVar10) break;
        local_7c = *in_stack_00000018 + local_7c;
        dVar17 = *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2) *
                            8) -
                 *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8);
        dVar18 = *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 2) *
                            8) +
                 *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8);
        dVar19 = *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8) -
                 *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8);
        dVar20 = *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8) +
                 *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 2
                                  ) * 8);
        dVar21 = *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1) *
                            8) -
                 *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8);
        dVar22 = *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 + 1) * iVar3) * iVar2) * 2 + 1) *
                            8) +
                 *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 3 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8);
        dVar23 = *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8) -
                 *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8);
        dVar24 = *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 2 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8) +
                 *(double *)
                  (lVar14 + (long)((local_78 + (local_74 + (iVar4 * 4 + 1) * iVar3) * iVar2) * 2 + 1
                                  ) * 8);
        *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 5) * iVar5) * 2 + 1) * 8) =
             dVar22 + dVar24;
        *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 7) * iVar5) * 2 + 1) * 8) =
             dVar22 - dVar24;
        *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 5) * iVar5) * 2 + 2) * 8) =
             dVar18 + dVar20;
        *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 7) * iVar5) * 2 + 2) * 8) =
             dVar18 - dVar20;
        *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 6) * iVar5) * 2 + 1) * 8) =
             dVar21 + dVar19;
        *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 8) * iVar5) * 2 + 1) * 8) =
             dVar21 - dVar19;
        *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 6) * iVar5) * 2 + 2) * 8) =
             dVar17 + dVar23;
        *(double *)(lVar15 + (long)((local_7c + (local_74 + iVar6 * 8) * iVar5) * 2 + 2) * 8) =
             dVar17 - dVar23;
        local_78 = iVar8 + local_78;
      }
    }
    iVar7 = *in_RSI;
    for (tr4._0_4_ = 2; tr4._0_4_ <= iVar7; tr4._0_4_ = tr4._0_4_ + 1) {
      iVar8 = *in_RDX;
      for (local_74 = 1; local_74 <= iVar8; local_74 = local_74 + 1) {
        iVar9 = *in_R9;
        local_78 = 1;
        local_7c = iVar12;
        while( true ) {
          if (iVar9 < 0) {
            bVar10 = iVar11 <= local_78;
          }
          else {
            bVar10 = local_78 <= iVar11;
          }
          if (!bVar10) break;
          local_7c = *in_stack_00000018 + local_7c;
          dVar24 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (tr4._0_4_ + iVar4) * iVar3) * iVar2) *
                                     2 + 2) * 8) -
                   *(double *)
                    (lVar14 + (long)((local_78 +
                                     (local_74 + (tr4._0_4_ + iVar4 * 3) * iVar3) * iVar2) * 2 + 2)
                              * 8);
          dVar22 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (tr4._0_4_ + iVar4) * iVar3) * iVar2) *
                                     2 + 2) * 8) +
                   *(double *)
                    (lVar14 + (long)((local_78 +
                                     (local_74 + (tr4._0_4_ + iVar4 * 3) * iVar3) * iVar2) * 2 + 2)
                              * 8);
          dVar17 = *(double *)
                    (lVar14 + (long)((local_78 +
                                     (local_74 + (tr4._0_4_ + iVar4 * 2) * iVar3) * iVar2) * 2 + 2)
                              * 8) +
                   *(double *)
                    (lVar14 + (long)((local_78 +
                                     (local_74 + (tr4._0_4_ + iVar4 * 4) * iVar3) * iVar2) * 2 + 2)
                              * 8);
          dVar18 = *(double *)
                    (lVar14 + (long)((local_78 +
                                     (local_74 + (tr4._0_4_ + iVar4 * 2) * iVar3) * iVar2) * 2 + 2)
                              * 8) -
                   *(double *)
                    (lVar14 + (long)((local_78 +
                                     (local_74 + (tr4._0_4_ + iVar4 * 4) * iVar3) * iVar2) * 2 + 2)
                              * 8);
          dVar23 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (tr4._0_4_ + iVar4) * iVar3) * iVar2) *
                                     2 + 1) * 8) -
                   *(double *)
                    (lVar14 + (long)((local_78 +
                                     (local_74 + (tr4._0_4_ + iVar4 * 3) * iVar3) * iVar2) * 2 + 1)
                              * 8);
          dVar21 = *(double *)
                    (lVar14 + (long)((local_78 + (local_74 + (tr4._0_4_ + iVar4) * iVar3) * iVar2) *
                                     2 + 1) * 8) +
                   *(double *)
                    (lVar14 + (long)((local_78 +
                                     (local_74 + (tr4._0_4_ + iVar4 * 3) * iVar3) * iVar2) * 2 + 1)
                              * 8);
          dVar19 = *(double *)
                    (lVar14 + (long)((local_78 +
                                     (local_74 + (tr4._0_4_ + iVar4 * 4) * iVar3) * iVar2) * 2 + 1)
                              * 8) -
                   *(double *)
                    (lVar14 + (long)((local_78 +
                                     (local_74 + (tr4._0_4_ + iVar4 * 2) * iVar3) * iVar2) * 2 + 1)
                              * 8);
          dVar20 = *(double *)
                    (lVar14 + (long)((local_78 +
                                     (local_74 + (tr4._0_4_ + iVar4 * 2) * iVar3) * iVar2) * 2 + 1)
                              * 8) +
                   *(double *)
                    (lVar14 + (long)((local_78 +
                                     (local_74 + (tr4._0_4_ + iVar4 * 4) * iVar3) * iVar2) * 2 + 1)
                              * 8);
          *(double *)
           (lVar15 + (long)((local_7c + (local_74 + (tr4._0_4_ * 4 + 1) * iVar6) * iVar5) * 2 + 1) *
                     8) = dVar21 + dVar20;
          dVar21 = dVar21 - dVar20;
          *(double *)
           (lVar15 + (long)((local_7c + (local_74 + (tr4._0_4_ * 4 + 1) * iVar6) * iVar5) * 2 + 2) *
                     8) = dVar22 + dVar17;
          dVar22 = dVar22 - dVar17;
          dVar17 = dVar23 + dVar18;
          dVar23 = dVar23 - dVar18;
          dVar18 = dVar24 + dVar19;
          dVar24 = dVar24 - dVar19;
          *(double *)
           (lVar15 + (long)((local_7c + (local_74 + (tr4._0_4_ * 4 + 2) * iVar6) * iVar5) * 2 + 1) *
                     8) =
               *(double *)(lVar13 + (long)(tr4._0_4_ + iVar1 * 4) * 8) * dVar17 +
               *(double *)(lVar13 + (long)(tr4._0_4_ + iVar1 * 7) * 8) * dVar18;
          *(double *)
           (lVar15 + (long)((local_7c + (local_74 + (tr4._0_4_ * 4 + 2) * iVar6) * iVar5) * 2 + 2) *
                     8) =
               *(double *)(lVar13 + (long)(tr4._0_4_ + iVar1 * 4) * 8) * dVar18 +
               -(*(double *)(lVar13 + (long)(tr4._0_4_ + iVar1 * 7) * 8) * dVar17);
          *(double *)
           (lVar15 + (long)((local_7c + (local_74 + (tr4._0_4_ * 4 + 3) * iVar6) * iVar5) * 2 + 1) *
                     8) =
               *(double *)(lVar13 + (long)(tr4._0_4_ + iVar1 * 5) * 8) * dVar21 +
               *(double *)(lVar13 + (long)(tr4._0_4_ + iVar1 * 8) * 8) * dVar22;
          *(double *)
           (lVar15 + (long)((local_7c + (local_74 + (tr4._0_4_ * 4 + 3) * iVar6) * iVar5) * 2 + 2) *
                     8) =
               *(double *)(lVar13 + (long)(tr4._0_4_ + iVar1 * 5) * 8) * dVar22 +
               -(*(double *)(lVar13 + (long)(tr4._0_4_ + iVar1 * 8) * 8) * dVar21);
          *(double *)
           (lVar15 + (long)((local_7c + (local_74 + (tr4._0_4_ * 4 + 4) * iVar6) * iVar5) * 2 + 1) *
                     8) =
               *(double *)(lVar13 + (long)(tr4._0_4_ + iVar1 * 6) * 8) * dVar23 +
               *(double *)(lVar13 + (long)(tr4._0_4_ + iVar1 * 9) * 8) * dVar24;
          *(double *)
           (lVar15 + (long)((local_7c + (local_74 + (tr4._0_4_ * 4 + 4) * iVar6) * iVar5) * 2 + 2) *
                     8) =
               *(double *)(lVar13 + (long)(tr4._0_4_ + iVar1 * 6) * 8) * dVar24 +
               -(*(double *)(lVar13 + (long)(tr4._0_4_ + iVar1 * 9) * 8) * dVar23);
          local_78 = iVar9 + local_78;
        }
      }
    }
  }
  return 0;
}

Assistant:

int cmf4kf_(int *lot, int *ido, int *l1, int
	*na, fft_real_t *cc, int *im1, int *in1, fft_real_t *ch, int *im2,
	int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int cc_dim2, cc_dim3, cc_dim4, cc_offset, ch_dim2, ch_dim3, ch_offset,
	     wa_dim1, wa_offset, i__1, i__2, i__3, i__4;

    /* Local variables */
     int i__, k, m1, m2;
     fft_real_t sn, ci2, ci3, ci4;
     int m1d;
     fft_real_t cr3, cr2, cr4, ti1, ti2, ti3, ti4;
     int m2s;
     fft_real_t tr1, tr2, tr3, tr4;


/* FFTPACK 5.0 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_offset = 1 + (wa_dim1 << 2);
    wa -= wa_offset;
    cc_dim2 = *in1;
    cc_dim3 = *l1;
    cc_dim4 = *ido;
    cc_offset = 1 + 2 * (1 + cc_dim2 * (1 + cc_dim3 * (1 + cc_dim4)));
    cc -= cc_offset;
    ch_dim2 = *in2;
    ch_dim3 = *l1;
    ch_offset = 1 + 2 * (1 + ch_dim2 * (1 + ch_dim3 * 5));
    ch -= ch_offset;

    /* Function Body */
    m1d = (*lot - 1) * *im1 + 1;
    m2s = 1 - *im2;
    if (*ido > 1) {
	goto L102;
    }
    sn = 1.0 / (fft_real_t) (*l1 << 2);
    if (*na == 1) {
	goto L106;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    ti1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    ti2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    tr4 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    tr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    ti4 = cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1] = sn *
		     (tr2 + tr3);
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 1] =
		    sn * (tr2 - tr3);
	    cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2] = sn *
		     (ti2 + ti3);
	    cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 << 1) + 2] =
		    sn * (ti2 - ti3);
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = sn * (tr1 + tr4);
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		     = sn * (tr1 - tr4);
	    cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = sn * (ti1 + ti4);
	    cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		     = sn * (ti1 - ti4);
/* L101: */
	}
    }
    return 0;
L106:
    i__3 = *l1;
    for (k = 1; k <= i__3; ++k) {
	m2 = m2s;
	i__2 = m1d;
	i__1 = *im1;
	for (m1 = 1; i__1 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__1) {
	    m2 += *im2;
	    ti1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    ti2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    tr4 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    tr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    ti4 = cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 1] = sn * (tr2 + tr3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 1] = sn * (tr2 - tr3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 2] = sn * (ti2 + ti3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 2] = sn * (ti2 - ti3)
		    ;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 1] = sn * (tr1 + tr4)
		    ;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 1] = sn * (tr1 -
		    tr4);
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 2] = sn * (ti1 + ti4)
		    ;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 2] = sn * (ti1 -
		    ti4);
/* L107: */
	}
    }
    return 0;
L102:
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	m2 = m2s;
	i__2 = m1d;
	i__3 = *im1;
	for (m1 = 1; i__3 < 0 ? m1 >= i__2 : m1 <= i__2; m1 += i__3) {
	    m2 += *im2;
	    ti1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    ti2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 2]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2];
	    tr4 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] - cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    ti3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 2] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 2];
	    tr1 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    - cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    tr2 = cc[(m1 + (k + (cc_dim4 + 1) * cc_dim3) * cc_dim2 << 1) + 1]
		    + cc[(m1 + (k + (cc_dim4 * 3 + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1];
	    ti4 = cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] - cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    tr3 = cc[(m1 + (k + ((cc_dim4 << 1) + 1) * cc_dim3) * cc_dim2 <<
		    1) + 1] + cc[(m1 + (k + ((cc_dim4 << 2) + 1) * cc_dim3) *
		    cc_dim2 << 1) + 1];
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 1] = tr2 + tr3;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 1] = tr2 - tr3;
	    ch[(m2 + (k + ch_dim3 * 5) * ch_dim2 << 1) + 2] = ti2 + ti3;
	    ch[(m2 + (k + ch_dim3 * 7) * ch_dim2 << 1) + 2] = ti2 - ti3;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 1] = tr1 + tr4;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 1] = tr1 - tr4;
	    ch[(m2 + (k + ch_dim3 * 6) * ch_dim2 << 1) + 2] = ti1 + ti4;
	    ch[(m2 + (k + (ch_dim3 << 3)) * ch_dim2 << 1) + 2] = ti1 - ti4;
/* L103: */
	}
    }
    i__3 = *ido;
    for (i__ = 2; i__ <= i__3; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    m2 = m2s;
	    i__1 = m1d;
	    i__4 = *im1;
	    for (m1 = 1; i__4 < 0 ? m1 >= i__1 : m1 <= i__1; m1 += i__4) {
		m2 += *im2;
		ti1 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] - cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 2];
		ti2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 2] + cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 2];
		ti3 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] + cc[(m1 + (k + (i__ + (cc_dim4 <<
			2)) * cc_dim3) * cc_dim2 << 1) + 2];
		tr4 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 2] - cc[(m1 + (k + (i__ + (cc_dim4 <<
			2)) * cc_dim3) * cc_dim2 << 1) + 2];
		tr1 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] - cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 1];
		tr2 = cc[(m1 + (k + (i__ + cc_dim4) * cc_dim3) * cc_dim2 << 1)
			 + 1] + cc[(m1 + (k + (i__ + cc_dim4 * 3) * cc_dim3) *
			 cc_dim2 << 1) + 1];
		ti4 = cc[(m1 + (k + (i__ + (cc_dim4 << 2)) * cc_dim3) *
			cc_dim2 << 1) + 1] - cc[(m1 + (k + (i__ + (cc_dim4 <<
			1)) * cc_dim3) * cc_dim2 << 1) + 1];
		tr3 = cc[(m1 + (k + (i__ + (cc_dim4 << 1)) * cc_dim3) *
			cc_dim2 << 1) + 1] + cc[(m1 + (k + (i__ + (cc_dim4 <<
			2)) * cc_dim3) * cc_dim2 << 1) + 1];
		ch[(m2 + (k + ((i__ << 2) + 1) * ch_dim3) * ch_dim2 << 1) + 1]
			 = tr2 + tr3;
		cr3 = tr2 - tr3;
		ch[(m2 + (k + ((i__ << 2) + 1) * ch_dim3) * ch_dim2 << 1) + 2]
			 = ti2 + ti3;
		ci3 = ti2 - ti3;
		cr2 = tr1 + tr4;
		cr4 = tr1 - tr4;
		ci2 = ti1 + ti4;
		ci4 = ti1 - ti4;
		ch[(m2 + (k + ((i__ << 2) + 2) * ch_dim3) * ch_dim2 << 1) + 1]
			 = wa[i__ + (wa_dim1 << 2)] * cr2 + wa[i__ + wa_dim1 *
			 7] * ci2;
		ch[(m2 + (k + ((i__ << 2) + 2) * ch_dim3) * ch_dim2 << 1) + 2]
			 = wa[i__ + (wa_dim1 << 2)] * ci2 - wa[i__ + wa_dim1 *
			 7] * cr2;
		ch[(m2 + (k + ((i__ << 2) + 3) * ch_dim3) * ch_dim2 << 1) + 1]
			 = wa[i__ + wa_dim1 * 5] * cr3 + wa[i__ + (wa_dim1 <<
			3)] * ci3;
		ch[(m2 + (k + ((i__ << 2) + 3) * ch_dim3) * ch_dim2 << 1) + 2]
			 = wa[i__ + wa_dim1 * 5] * ci3 - wa[i__ + (wa_dim1 <<
			3)] * cr3;
		ch[(m2 + (k + ((i__ << 2) + 4) * ch_dim3) * ch_dim2 << 1) + 1]
			 = wa[i__ + wa_dim1 * 6] * cr4 + wa[i__ + wa_dim1 * 9]
			 * ci4;
		ch[(m2 + (k + ((i__ << 2) + 4) * ch_dim3) * ch_dim2 << 1) + 2]
			 = wa[i__ + wa_dim1 * 6] * ci4 - wa[i__ + wa_dim1 * 9]
			 * cr4;
/* L104: */
	    }
	}
/* L105: */
    }
    return 0;
}